

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

int __thiscall io::posix::file::open(file *this,char *__file,int __oflag,...)

{
  error_code *this_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  int *piVar2;
  value_type *__file_00;
  error_category *__cat;
  uint in_ECX;
  error_code *in_R8;
  file_descriptor_handle local_34;
  int local_2c;
  error_code *peStack_28;
  int new_fd;
  error_code *ec_local;
  mode_t create_perms_local;
  int mode_local;
  path *path_local;
  file *this_local;
  
  peStack_28 = in_R8;
  ec_local._0_4_ = in_ECX;
  ec_local._4_4_ = __oflag;
  _create_perms_local = (path *)__file;
  path_local = (path *)this;
  std::error_code::clear(in_R8);
  piVar2 = __errno_location();
  *piVar2 = 0;
  __file_00 = std::filesystem::__cxx11::path::c_str(_create_perms_local);
  local_2c = ::open(__file_00,ec_local._4_4_,(ulong)(uint)ec_local);
  this_00 = peStack_28;
  if (local_2c < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    __cat = (error_category *)std::_V2::system_category();
    std::error_code::assign(this_00,iVar1,__cat);
    iVar1 = extraout_EAX;
  }
  else {
    file_descriptor_handle::file_descriptor_handle(&local_34,local_2c,true);
    file_descriptor_handle::operator=(&this->fd_,&local_34);
    file_descriptor_handle::~file_descriptor_handle(&local_34);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void open(const io_std::filesystem::path& path,
              int mode, ::mode_t create_perms, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        int new_fd = ::open(path.c_str(), mode, create_perms);

        if (new_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }

        fd_ = posix::file_descriptor_handle{new_fd};
    }